

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Crop_x86::forward
          (Crop_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Crop *this_00;
  Mat *src;
  Mat *this_01;
  void *__ptr;
  Allocator *pAVar1;
  bool bVar2;
  bool bVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  undefined1 uVar7;
  undefined1 uVar9;
  undefined1 uVar11;
  undefined8 uVar12;
  undefined4 uVar19;
  undefined1 uVar20;
  undefined1 uVar22;
  undefined1 uVar24;
  undefined1 uVar26;
  undefined8 uVar27;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  int *piVar38;
  pointer pMVar39;
  int iVar40;
  int *piVar41;
  ulong uVar42;
  uint uVar43;
  ulong uVar44;
  long lVar45;
  uint uVar46;
  int iVar47;
  size_t sVar48;
  Option *pOVar49;
  long lVar50;
  bool bVar51;
  int iVar52;
  uint uVar53;
  int iVar54;
  Mat m;
  int _outw;
  int _woffset;
  Mat m_1;
  int _outh;
  int _outc;
  int _outd;
  int _hoffset;
  ulong local_d0;
  size_t local_c8;
  int _coffset;
  int local_b8;
  uint uStack_b4;
  uint uStack_b0;
  int iStack_ac;
  Option *local_a0;
  long local_98;
  int _doffset;
  int local_8c;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs_unpacked;
  undefined4 uVar6;
  undefined3 uVar8;
  undefined2 uVar10;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined3 uVar15;
  undefined1 uVar16;
  undefined2 uVar17;
  undefined1 uVar18;
  undefined4 uVar21;
  undefined3 uVar23;
  undefined2 uVar25;
  undefined1 uVar28;
  undefined1 uVar29;
  undefined3 uVar30;
  undefined1 uVar31;
  undefined2 uVar32;
  undefined1 uVar33;
  
  src = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
  uVar46 = src->c;
  local_d0 = (ulong)uVar46;
  iVar52 = src->dims;
  uVar43 = src->w;
  uVar53 = src->h;
  iVar54 = src->d;
  sVar48 = src->elemsize;
  iVar40 = src->elempack;
  iVar47 = src[1].elempack;
  lVar45 = (long)iVar47;
  m.elempack = iVar40;
  if (iVar40 != 4) goto LAB_0025ff71;
  this_01 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  this_00 = (Crop *)((long)&this->_vptr_Crop_x86 + (long)this->_vptr_Crop_x86[-3]);
  m.w = uVar43;
  m.h = uVar53;
  m.d = iVar54;
  local_c8 = sVar48;
  local_b8 = iVar52;
  uStack_b4 = uVar43;
  uStack_b0 = uVar53;
  iStack_ac = iVar54;
  local_a0 = opt;
  local_98 = lVar45;
  local_8c = iVar40;
  if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Crop_x86[-3]) != -0xe9) {
    switch(iVar52 + -1) {
    case 0:
      m.w = uVar43 << 2;
      m.dims = 1;
      m.h = 1;
      m.c = 1;
      m.cstep = (size_t)m.w;
      break;
    case 1:
      m.h = uVar53 << 2;
      m.dims = 2;
      m.c = 1;
      m.cstep = (long)m.h * (long)(int)uVar43;
      break;
    case 2:
      m.c = uVar46 * 4;
      m.dims = 3;
      m.cstep = (long)(int)uVar53 * (long)(int)uVar43 + 3U & 0x3ffffffffffffffc;
      break;
    case 3:
      m.c = uVar46 * 4;
      m.elemsize = 4;
      m.elempack = 1;
      m.dims = 4;
      m.cstep = (long)iVar54 * (long)(int)uVar53 * (long)(int)uVar43 + 3U & 0x3ffffffffffffffc;
      goto LAB_0025f63c;
    default:
      m.cstep = 0;
      m.elemsize = 0;
      m.elempack = 0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
      goto LAB_0025f63c;
    }
    m.d = 1;
    m.elempack = 1;
    m.elemsize = 4;
LAB_0025f63c:
    m.allocator = (Allocator *)0x0;
    m.refcount._4_4_ = 0;
    m.refcount._0_4_ = 0;
    m.data = (void *)0x0;
    switch(src[1].dims) {
    case 1:
      m_1.cstep = src[1].w * lVar45;
      m_1.dims = 1;
      m_1.w = (int)m_1.cstep;
      m_1.h = 1;
      m_1.d = 1;
      m_1.c = 1;
      goto LAB_0025f7aa;
    case 2:
      m_1.w = src[1].w;
      lVar45 = src[1].h * lVar45;
      m_1.elemsize = 4;
      m_1.elempack = 1;
      m_1.dims = 2;
      m_1.h = (int)lVar45;
      m_1.d = 1;
      m_1.c = 1;
      m_1.cstep = lVar45 * m_1.w;
      break;
    case 3:
      m_1.w = src[1].w;
      m_1.h = src[1].h;
      iVar40 = src[1].c;
      m_1.dims = 3;
      m_1.d = 1;
      lVar45 = (long)m_1.h * (long)m_1.w;
      goto LAB_0025f799;
    case 4:
      m_1.w = src[1].w;
      m_1.h = src[1].h;
      m_1.d = src[1].d;
      iVar40 = src[1].c;
      m_1.dims = 4;
      lVar45 = (long)m_1.h * (long)m_1.w * (long)m_1.d;
LAB_0025f799:
      m_1.c = iVar40 * iVar47;
      m_1.cstep = lVar45 + 3U & 0x3ffffffffffffffc;
LAB_0025f7aa:
      m_1.elempack = 1;
      m_1.elemsize = 4;
      break;
    default:
      m_1.cstep = 0;
      m_1.elemsize = 0;
      m_1.elempack = 0;
      m_1.dims = 0;
      m_1.w = 0;
      m_1.h = 0;
      m_1.d = 0;
      m_1.c = 0;
    }
    m_1.allocator = (Allocator *)0x0;
    m_1.refcount._4_4_ = 0;
    m_1.refcount._0_4_ = 0;
    m_1.data = (void *)0x0;
    piVar41 = &_hoffset;
    Crop::resolve_crop_roi
              (this_00,&m,&m_1,&_woffset,piVar41,&_doffset,&_coffset,&_outw,&_outh,&_outd,&_outc);
    piVar38 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
    if (piVar38 != (int *)0x0) {
      LOCK();
      *piVar38 = *piVar38 + -1;
      UNLOCK();
      if (*piVar38 == 0) {
        if (m_1.allocator == (Allocator *)0x0) {
          if (m_1.data != (void *)0x0) {
            free(m_1.data);
          }
        }
        else {
          (*(m_1.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar38 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar38 != (int *)0x0) {
      LOCK();
      *piVar38 = *piVar38 + -1;
      UNLOCK();
      if (*piVar38 != 0) goto LAB_0025f920;
      if (m.allocator != (Allocator *)0x0) {
        (*(m.allocator)->_vptr_Allocator[3])();
        goto LAB_0025f920;
      }
      if (m.data == (void *)0x0) goto LAB_0025f920;
      goto LAB_0025f918;
    }
    goto LAB_0025f920;
  }
  switch(iVar52 + -1) {
  case 0:
    m.w = uVar43 << 2;
    m.dims = 1;
    m.h = 1;
    m.c = 1;
    m.cstep = (size_t)m.w;
    break;
  case 1:
    m.h = uVar53 << 2;
    m.dims = 2;
    m.c = 1;
    m.cstep = (long)m.h * (long)(int)uVar43;
    break;
  case 2:
    m.c = uVar46 * 4;
    m.dims = 3;
    m.cstep = (long)(int)uVar53 * (long)(int)uVar43 + 3U & 0x3ffffffffffffffc;
    break;
  case 3:
    m.c = uVar46 * 4;
    m.elemsize = 4;
    m.elempack = 1;
    m.dims = 4;
    m.cstep = (long)iVar54 * (long)(int)uVar53 * (long)(int)uVar43 + 3U & 0x3ffffffffffffffc;
    goto LAB_0025f582;
  default:
    m.cstep = 0;
    m.elemsize = 0;
    m.elempack = 0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
    goto LAB_0025f582;
  }
  m.d = 1;
  m.elempack = 1;
  m.elemsize = 4;
LAB_0025f582:
  m.allocator = (Allocator *)0x0;
  m.refcount._4_4_ = 0;
  m.refcount._0_4_ = 0;
  m.data = (void *)0x0;
  piVar41 = &_hoffset;
  Crop::resolve_crop_roi
            (this_00,&m,(int *)src[1].data,&_woffset,piVar41,&_doffset,&_coffset,&_outw,&_outh,
             &_outd,&_outc);
  piVar38 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
  if (piVar38 != (int *)0x0) {
    LOCK();
    *piVar38 = *piVar38 + -1;
    UNLOCK();
    if (*piVar38 == 0) {
      if (m.allocator == (Allocator *)0x0) {
        if (m.data != (void *)0x0) {
LAB_0025f918:
          free(m.data);
        }
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_0025f920:
  pOVar49 = local_a0;
  if (3 < iVar52 - 1U) goto LAB_0025ff30;
  iVar40 = _outc >> 2;
  switch(iVar52) {
  case 1:
    uVar46 = _outw & 3;
    iVar40 = (uint)(uVar46 == 0) * 3 + 1;
    uVar42 = (long)_outw % (long)iVar40;
    if (uStack_b4 == _outw / iVar40 && uVar46 == 0) {
      if (this_01 == src) {
        return 0;
      }
      piVar41 = src->refcount;
      if (piVar41 != (int *)0x0) {
        LOCK();
        *piVar41 = *piVar41 + 1;
        UNLOCK();
      }
      piVar41 = this_01->refcount;
      if (piVar41 == (int *)0x0) goto LAB_00260358;
      LOCK();
      *piVar41 = *piVar41 + -1;
      UNLOCK();
      if (*piVar41 != 0) goto LAB_00260358;
      __ptr = this_01->data;
      pAVar1 = this_01->allocator;
joined_r0x0025fb8d:
      if (pAVar1 == (Allocator *)0x0) {
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
      }
      else {
        (*pAVar1->_vptr_Allocator[3])(pAVar1,__ptr,uVar42 & 0xffffffff);
      }
LAB_00260358:
      this_01->cstep = 0;
      this_01->data = (void *)0x0;
      this_01->refcount = (int *)0x0;
      *(undefined1 (*) [16])((long)&this_01->refcount + 4) = (undefined1  [16])0x0;
      this_01->dims = 0;
      this_01->w = 0;
      this_01->h = 0;
      this_01->d = 0;
      this_01->c = 0;
      piVar41 = src->refcount;
      this_01->data = src->data;
      this_01->refcount = piVar41;
      this_01->elemsize = src->elemsize;
      this_01->elempack = src->elempack;
      this_01->allocator = src->allocator;
      iVar40 = src->w;
      iVar47 = src->h;
      iVar52 = src->d;
      this_01->dims = src->dims;
      this_01->w = iVar40;
      this_01->h = iVar47;
      this_01->d = iVar52;
      this_01->c = src->c;
      this_01->cstep = src->cstep;
      return 0;
    }
    if (((_outw | _woffset) & 3U) == 0) {
      Mat::create(this_01,_outw / iVar40,(local_c8 >> 2) << (uVar46 == 0) * '\x02',iVar40,
                  local_a0->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep == 0) {
        return -100;
      }
      iVar40 = _woffset + 3;
      if (-1 < _woffset) {
        iVar40 = _woffset;
      }
      crop_pack4_sse(src,this_01,0,iVar40 >> 2);
      return 0;
    }
    break;
  case 2:
    if (_outw == uStack_b4) {
      iVar40 = (uint)((_outh & 3U) == 0) * 3 + 1;
      uVar42 = (long)_outh % (long)iVar40;
      if (((_outh & 3U) == 0) && (_outh / iVar40 == uStack_b0)) {
        if (this_01 == src) {
          return 0;
        }
        piVar41 = src->refcount;
        if (piVar41 != (int *)0x0) {
          LOCK();
          *piVar41 = *piVar41 + 1;
          UNLOCK();
        }
        piVar41 = this_01->refcount;
        if (piVar41 == (int *)0x0) goto LAB_00260358;
        LOCK();
        *piVar41 = *piVar41 + -1;
        UNLOCK();
        if (*piVar41 != 0) goto LAB_00260358;
        __ptr = this_01->data;
        pAVar1 = this_01->allocator;
        goto joined_r0x0025fb8d;
      }
    }
    if (((_hoffset | _outh) & 3U) == 0) {
      Mat::create(this_01,_outw,_outh >> 2,(local_c8 >> 2) << ((_outh & 3U) == 0) * '\x02',4,
                  local_a0->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep == 0) {
        return -100;
      }
      iVar40 = _hoffset + 3;
      if (-1 < _hoffset) {
        iVar40 = _hoffset;
      }
      crop_pack4_sse(src,this_01,iVar40 >> 2,_woffset);
      return 0;
    }
    break;
  case 3:
    uVar46 = _outc & 3;
    uVar44 = local_c8 >> 2;
    uVar43 = uStack_b0 ^ _outh | uStack_b4 ^ _outw;
    bVar51 = uVar43 == 0;
    if (bVar51) {
      iVar47 = (uint)((_outc & 3U) == 0) * 3 + 1;
      uVar42 = (long)_outc % (long)iVar47;
      if (((_outc & 3U) == 0) && (_outc / iVar47 == (int)local_d0)) {
        if (this_01 == src) {
          return 0;
        }
        piVar41 = src->refcount;
        if (piVar41 != (int *)0x0) {
          LOCK();
          *piVar41 = *piVar41 + 1;
          UNLOCK();
        }
        piVar41 = this_01->refcount;
        if (piVar41 == (int *)0x0) goto LAB_00260358;
        LOCK();
        *piVar41 = *piVar41 + -1;
        UNLOCK();
        if (*piVar41 != 0) goto LAB_00260358;
        __ptr = this_01->data;
        pAVar1 = this_01->allocator;
        goto joined_r0x0025fb8d;
      }
    }
    if (((_coffset | _outc) & 3U) != 0) break;
    m.w = src->w;
    m.h = src->h;
    m.d = src->d;
    m.elemsize = src->elemsize;
    m.data = (void *)((long)(_coffset >> 2) * src->cstep * m.elemsize + (long)src->data);
    m.elempack = src->elempack;
    m.allocator = src->allocator;
    m.refcount._0_4_ = 0;
    m.refcount._4_4_ = 0;
    m.cstep = ((long)m.d * m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) /
              m.elemsize;
    m.dims = src->dims;
    m.c = iVar40;
    if (bVar51) {
      Mat::clone(&m_1,(__fn *)&m,(void *)0x0,CONCAT31((int3)(uVar43 >> 8),bVar51),
                 (void *)(ulong)(uint)_outh);
      piVar41 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
      if (this_01 != &m_1) {
        if (piVar41 != (int *)0x0) {
          LOCK();
          *piVar41 = *piVar41 + 1;
          UNLOCK();
        }
        piVar41 = this_01->refcount;
        if (piVar41 != (int *)0x0) {
          LOCK();
          *piVar41 = *piVar41 + -1;
          UNLOCK();
          if (*piVar41 == 0) {
            if (this_01->allocator == (Allocator *)0x0) {
              if (this_01->data != (void *)0x0) {
                free(this_01->data);
              }
            }
            else {
              (*this_01->allocator->_vptr_Allocator[3])();
            }
          }
        }
        this_01->data = m_1.data;
        piVar41 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
        this_01->refcount = piVar41;
        this_01->elemsize = m_1.elemsize;
        this_01->elempack = m_1.elempack;
        this_01->allocator = m_1.allocator;
        this_01->dims = m_1.dims;
        this_01->w = m_1.w;
        this_01->h = m_1.h;
        this_01->d = m_1.d;
        this_01->c = m_1.c;
        this_01->cstep = m_1.cstep;
      }
      if (piVar41 != (int *)0x0) {
        LOCK();
        *piVar41 = *piVar41 + -1;
        UNLOCK();
        if (*piVar41 == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            if (m_1.data != (void *)0x0) {
              free(m_1.data);
            }
          }
          else {
            (*(m_1.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar40 = -100;
      if ((this_01->data != (void *)0x0) && ((long)this_01->c * this_01->cstep != 0))
      goto LAB_0026049c;
    }
    else {
LAB_0026049c:
      iVar40 = _outc + 3;
      if (-1 < _outc) {
        iVar40 = _outc;
      }
      Mat::create(this_01,_outw,_outh,iVar40 >> 2,uVar44 << (uVar46 == 0) * '\x02',4,
                  pOVar49->blob_allocator);
      iVar40 = -100;
      if ((this_01->data != (void *)0x0) && (this_01->cstep * (long)this_01->c != 0)) {
        if (0 < this_01->c) {
          lVar45 = 0;
          do {
            m_1.data = (void *)(m.cstep * lVar45 * m.elemsize + (long)m.data);
            m_1.refcount._0_4_ = 0;
            m_1.refcount._4_4_ = 0;
            m_1.elemsize = m.elemsize;
            m_1.elempack = m.elempack;
            m_1.allocator = m.allocator;
            m_1.w = m.w;
            m_1.h = m.h;
            m_1.d = 1;
            m_1.c = m.d;
            m_1.dims = m.dims + -1;
            m_1.cstep = (m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / m.elemsize
            ;
            if (m.dims == 4) {
              m_1.cstep = (long)m.h * (long)m.w;
            }
            bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)this_01->elemsize;
            bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)(this_01->cstep * lVar45 *
                           (long)bottom_blobs_unpacked.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage + (long)this_01->data);
            bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            crop_pack4_sse(&m_1,(Mat *)&bottom_blobs_unpacked,_hoffset,_woffset);
            lVar45 = lVar45 + 1;
          } while (lVar45 < this_01->c);
        }
        iVar40 = 0;
      }
    }
    piVar41 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar41 == (int *)0x0) {
      return iVar40;
    }
    LOCK();
    *piVar41 = *piVar41 + -1;
    UNLOCK();
    if (*piVar41 != 0) {
      return iVar40;
    }
    if (m.allocator != (Allocator *)0x0) {
      (*(m.allocator)->_vptr_Allocator[3])();
      return iVar40;
    }
joined_r0x002609d6:
    m.allocator = (Allocator *)0x0;
    if (m.data == (void *)0x0) {
      return iVar40;
    }
    goto LAB_002602c0;
  case 4:
    sVar48 = (local_c8 >> 2) << ((_outc & 3U) == 0) * '\x02';
    bVar51 = uStack_b4 == _outd;
    bVar2 = uStack_b0 == _outh;
    bVar3 = uStack_b4 == _outw;
    if (bVar51 && (bVar2 && bVar3)) {
      iVar47 = (uint)((_outc & 3U) == 0) * 3 + 1;
      uVar42 = (long)_outc % (long)iVar47;
      if (((_outc & 3U) == 0) && (_outc / iVar47 == (int)local_d0)) {
        if (this_01 == src) {
          return 0;
        }
        piVar41 = src->refcount;
        if (piVar41 != (int *)0x0) {
          LOCK();
          *piVar41 = *piVar41 + 1;
          UNLOCK();
        }
        piVar41 = this_01->refcount;
        if (piVar41 == (int *)0x0) goto LAB_00260358;
        LOCK();
        *piVar41 = *piVar41 + -1;
        UNLOCK();
        if (*piVar41 != 0) goto LAB_00260358;
        __ptr = this_01->data;
        pAVar1 = this_01->allocator;
        goto joined_r0x0025fb8d;
      }
    }
    local_c8 = sVar48;
    if (((_coffset | _outc) & 3U) == 0) {
      m.w = src->w;
      m.h = src->h;
      m.d = src->d;
      m.elemsize = src->elemsize;
      m.data = (void *)((long)(_coffset >> 2) * src->cstep * m.elemsize + (long)src->data);
      m.elempack = src->elempack;
      m.allocator = src->allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.cstep = ((long)m.d * m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) /
                m.elemsize;
      m.dims = src->dims;
      m.c = iVar40;
      if (bVar51 && (bVar2 && bVar3)) {
        Mat::clone(&m_1,(__fn *)&m,(void *)0x0,_outd,
                   (void *)CONCAT71((int7)((ulong)piVar41 >> 8),bVar51 && (bVar2 && bVar3)));
        pOVar49 = local_a0;
        sVar48 = local_c8;
        piVar41 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
        if (this_01 != &m_1) {
          if (piVar41 != (int *)0x0) {
            LOCK();
            *piVar41 = *piVar41 + 1;
            UNLOCK();
          }
          piVar41 = this_01->refcount;
          if (piVar41 != (int *)0x0) {
            LOCK();
            *piVar41 = *piVar41 + -1;
            UNLOCK();
            if (*piVar41 == 0) {
              if (this_01->allocator == (Allocator *)0x0) {
                if (this_01->data != (void *)0x0) {
                  free(this_01->data);
                }
              }
              else {
                (*this_01->allocator->_vptr_Allocator[3])();
              }
            }
          }
          this_01->data = m_1.data;
          piVar41 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
          this_01->refcount = piVar41;
          this_01->elemsize = m_1.elemsize;
          this_01->elempack = m_1.elempack;
          this_01->allocator = m_1.allocator;
          this_01->dims = m_1.dims;
          this_01->w = m_1.w;
          this_01->h = m_1.h;
          this_01->d = m_1.d;
          this_01->c = m_1.c;
          this_01->cstep = m_1.cstep;
        }
        if (piVar41 != (int *)0x0) {
          LOCK();
          *piVar41 = *piVar41 + -1;
          UNLOCK();
          if (*piVar41 == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              if (m_1.data != (void *)0x0) {
                free(m_1.data);
              }
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar40 = -100;
        if ((this_01->data != (void *)0x0) && ((long)this_01->c * this_01->cstep != 0))
        goto LAB_002607b1;
      }
      else {
LAB_002607b1:
        iVar40 = _outc + 3;
        if (-1 < _outc) {
          iVar40 = _outc;
        }
        Mat::create(this_01,_outw,_outh,_outd,iVar40 >> 2,sVar48,4,pOVar49->blob_allocator);
        iVar40 = -100;
        if (this_01->data != (void *)0x0) {
          uVar42 = (ulong)this_01->c;
          if (this_01->cstep * uVar42 != 0) {
            if (0 < this_01->c) {
              uVar44 = (ulong)(uint)_outd;
              lVar45 = 0;
              do {
                if (0 < (int)uVar44) {
                  lVar50 = 0;
                  do {
                    m_1.cstep = (long)m.h * (long)m.w;
                    m_1.data = (void *)((long)m.data +
                                       (long)(_doffset + (int)lVar50) * m.elemsize * m_1.cstep +
                                       m.cstep * lVar45 * m.elemsize);
                    m_1.refcount._0_4_ = 0;
                    m_1.refcount._4_4_ = 0;
                    m_1.elemsize = m.elemsize;
                    m_1.elempack = m.elempack;
                    m_1.allocator = m.allocator;
                    m_1.dims = 2;
                    m_1.w = m.w;
                    m_1.h = m.h;
                    m_1.d = 1;
                    m_1.c = 1;
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this_01->elemsize;
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start =
                         (pointer)((long)this_01->data +
                                  lVar50 * (long)bottom_blobs_unpacked.
                                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage
                                  * (long)this_01->h * (long)this_01->w +
                                  this_01->cstep * lVar45 *
                                  (long)bottom_blobs_unpacked.
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    crop_pack4_sse(&m_1,(Mat *)&bottom_blobs_unpacked,_hoffset,_woffset);
                    uVar44 = (ulong)_outd;
                    lVar50 = lVar50 + 1;
                  } while (lVar50 < (long)uVar44);
                  uVar42 = (ulong)(uint)this_01->c;
                }
                lVar45 = lVar45 + 1;
              } while (lVar45 < (int)uVar42);
            }
            iVar40 = 0;
          }
        }
      }
      piVar41 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar41 == (int *)0x0) {
        return iVar40;
      }
      LOCK();
      *piVar41 = *piVar41 + -1;
      UNLOCK();
      if (*piVar41 != 0) {
        return iVar40;
      }
      if (m.allocator != (Allocator *)0x0) {
        (*(m.allocator)->_vptr_Allocator[3])();
        return iVar40;
      }
      goto joined_r0x002609d6;
    }
  }
LAB_0025ff30:
  sVar48 = src->elemsize;
  iVar52 = src->dims;
  uVar43 = src->w;
  uVar53 = src->h;
  iVar54 = src->d;
  local_d0 = (ulong)(uint)src->c;
  iVar47 = (int)local_98;
  opt = local_a0;
  iVar40 = local_8c;
  m.elempack = src->elempack;
LAB_0025ff71:
  m.data = src->data;
  piVar41 = src->refcount;
  m.refcount._0_4_ = SUB84(piVar41,0);
  m.refcount._4_4_ = (undefined4)((ulong)piVar41 >> 0x20);
  m.allocator = src->allocator;
  m.c = (int)local_d0;
  m.cstep = src->cstep;
  if (piVar41 != (int *)0x0) {
    LOCK();
    *piVar41 = *piVar41 + 1;
    UNLOCK();
  }
  m.elemsize = sVar48;
  m.dims = iVar52;
  m.w = uVar43;
  m.h = uVar53;
  m.d = iVar54;
  if (iVar40 != 1) {
    m_1.data = *(void **)opt;
    m_1.elemsize = (size_t)opt->workspace_allocator;
    uVar4 = opt->openmp_blocktime;
    uVar5 = opt->use_winograd_convolution;
    uVar7 = opt->use_sgemm_convolution;
    uVar9 = opt->use_int8_inference;
    uVar11 = opt->use_vulkan_compute;
    uVar10 = CONCAT11(uVar11,uVar9);
    uVar8 = CONCAT21(uVar10,uVar7);
    uVar6 = CONCAT31(uVar8,uVar5);
    m_1.allocator = *(Allocator **)&opt->use_bf16_storage;
    uVar12._0_1_ = opt->use_shader_pack8;
    uVar12._1_1_ = opt->use_subgroup_basic;
    uVar12._2_1_ = opt->use_subgroup_vote;
    uVar12._3_1_ = opt->use_subgroup_ballot;
    uVar13 = opt->use_subgroup_shuffle;
    uVar14 = opt->use_image_storage;
    uVar16 = opt->use_tensor_storage;
    uVar18 = opt->use_reserved_0;
    uVar17 = CONCAT11(uVar18,uVar16);
    uVar15 = CONCAT21(uVar17,uVar14);
    uVar12._4_4_ = CONCAT31(uVar15,uVar13);
    uVar19 = opt->flush_denormals;
    uVar20 = opt->use_local_pool_allocator;
    uVar22 = opt->use_shader_local_memory;
    uVar24 = opt->use_cooperative_matrix;
    uVar26 = opt->use_winograd23_convolution;
    uVar25 = CONCAT11(uVar26,uVar24);
    uVar23 = CONCAT21(uVar25,uVar22);
    uVar21 = CONCAT31(uVar23,uVar20);
    uVar27._0_1_ = opt->use_winograd43_convolution;
    uVar27._1_1_ = opt->use_winograd63_convolution;
    uVar27._2_1_ = opt->use_a53_a55_optimized_kernel;
    uVar27._3_1_ = opt->use_reserved_7;
    uVar28 = opt->use_reserved_8;
    uVar29 = opt->use_reserved_9;
    uVar31 = opt->use_reserved_10;
    uVar33 = opt->use_reserved_11;
    uVar32 = CONCAT11(uVar33,uVar31);
    uVar30 = CONCAT21(uVar32,uVar29);
    uVar27._4_4_ = CONCAT31(uVar30,uVar28);
    m_1.c = (int)uVar27;
    m_1.dims = (int)uVar12;
    m_1.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
    m_1.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    m_1.elempack = uVar4;
    m_1._28_4_ = uVar6;
    m_1.w = uVar12._4_4_;
    m_1.h = uVar19;
    m_1.d = uVar21;
    m_1._60_4_ = uVar27._4_4_;
    convert_packing(src,&m,1,(Option *)&m_1);
  }
  m_1.data = src[1].data;
  piVar41 = src[1].refcount;
  m_1.refcount._0_4_ = SUB84(piVar41,0);
  m_1.refcount._4_4_ = (undefined4)((ulong)piVar41 >> 0x20);
  m_1.elemsize = src[1].elemsize;
  m_1.elempack = src[1].elempack;
  m_1.allocator = src[1].allocator;
  uVar34 = src[1].dims;
  uVar35 = src[1].w;
  uVar36 = src[1].h;
  uVar37 = src[1].d;
  m_1.c = src[1].c;
  m_1.cstep = src[1].cstep;
  if (piVar41 != (int *)0x0) {
    LOCK();
    *piVar41 = *piVar41 + 1;
    UNLOCK();
  }
  m_1.dims = uVar34;
  m_1.w = uVar35;
  m_1.h = uVar36;
  m_1.d = uVar37;
  if (iVar47 != 1) {
    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start = *(pointer *)opt;
    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)opt->workspace_allocator;
    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)opt->workspace_allocator;
    convert_packing(src + 1,&m_1,1,(Option *)&bottom_blobs_unpacked);
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (&bottom_blobs_unpacked,2,(allocator_type *)&_woffset);
  pMVar39 = bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start != &m) {
    piVar41 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar41 != (int *)0x0) {
      LOCK();
      *piVar41 = *piVar41 + 1;
      UNLOCK();
    }
    piVar41 = (bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
               _M_impl.super__Vector_impl_data._M_start)->refcount;
    if (piVar41 != (int *)0x0) {
      LOCK();
      *piVar41 = *piVar41 + -1;
      UNLOCK();
      if (*piVar41 == 0) {
        if ((bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
             .super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
          if ((bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
               _M_impl.super__Vector_impl_data._M_start)->data != (void *)0x0) {
            free((bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start)->data);
          }
        }
        else {
          (*(bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
             .super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
        }
      }
    }
    pMVar39->cstep = 0;
    pMVar39->data = (void *)0x0;
    pMVar39->refcount = (int *)0x0;
    *(undefined1 (*) [16])((long)&pMVar39->refcount + 4) = (undefined1  [16])0x0;
    pMVar39->dims = 0;
    pMVar39->w = 0;
    pMVar39->h = 0;
    pMVar39->d = 0;
    pMVar39->c = 0;
    pMVar39->data = m.data;
    pMVar39->refcount = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    pMVar39->elemsize = m.elemsize;
    pMVar39->elempack = m.elempack;
    pMVar39->allocator = m.allocator;
    pMVar39->dims = m.dims;
    pMVar39->w = m.w;
    pMVar39->h = m.h;
    pMVar39->d = m.d;
    pMVar39->c = m.c;
    pMVar39->cstep = m.cstep;
  }
  pMVar39 = bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start + 1 != &m_1) {
    piVar41 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
    if (piVar41 != (int *)0x0) {
      LOCK();
      *piVar41 = *piVar41 + 1;
      UNLOCK();
    }
    piVar41 = bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_start[1].refcount;
    if (piVar41 != (int *)0x0) {
      LOCK();
      *piVar41 = *piVar41 + -1;
      UNLOCK();
      if (*piVar41 == 0) {
        if (bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
          if (bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_start[1].data != (void *)0x0) {
            free(bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                 _M_impl.super__Vector_impl_data._M_start[1].data);
          }
        }
        else {
          (*(bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
             .super__Vector_impl_data._M_start[1].allocator)->_vptr_Allocator[3])();
        }
      }
    }
    pMVar39[1].data = m_1.data;
    pMVar39[1].refcount = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
    pMVar39[1].elemsize = m_1.elemsize;
    pMVar39[1].elempack = m_1.elempack;
    pMVar39[1].allocator = m_1.allocator;
    pMVar39[1].dims = m_1.dims;
    pMVar39[1].w = m_1.w;
    pMVar39[1].h = m_1.h;
    pMVar39[1].d = m_1.d;
    pMVar39[1].c = m_1.c;
    pMVar39[1].cstep = m_1.cstep;
  }
  iVar40 = Crop::forward((Crop *)((long)&this->_vptr_Crop_x86 + (long)this->_vptr_Crop_x86[-3]),
                         &bottom_blobs_unpacked,top_blobs,opt);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&bottom_blobs_unpacked);
  piVar41 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
  if (piVar41 != (int *)0x0) {
    LOCK();
    *piVar41 = *piVar41 + -1;
    UNLOCK();
    if (*piVar41 == 0) {
      if (m_1.allocator == (Allocator *)0x0) {
        if (m_1.data != (void *)0x0) {
          free(m_1.data);
        }
      }
      else {
        (*(m_1.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar41 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
  if (piVar41 != (int *)0x0) {
    LOCK();
    *piVar41 = *piVar41 + -1;
    UNLOCK();
    if (*piVar41 == 0) {
      if (m.allocator == (Allocator *)0x0) {
        if (m.data != (void *)0x0) {
LAB_002602c0:
          free(m.data);
        }
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar40;
}

Assistant:

int Crop_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int ref_elempack = reference_blob.elempack;

    Mat& top_blob = top_blobs[0];

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        if (woffset == -233)
        {
            resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }
        else
        {
            resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }

        if (dims == 1)
        {
            int out_elempack = _outw % 16 == 0 ? 16 : _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 16 == 0 ? 16 : _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        if (woffset == -233)
        {
            resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }
        else
        {
            resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }

        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        if (woffset == -233)
        {
            resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }
        else
        {
            resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }

        if (dims == 1)
        {
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    Mat reference_blob_unpacked = reference_blob;
    if (ref_elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(reference_blob, reference_blob_unpacked, 1, opt_pack1);
    }

    std::vector<Mat> bottom_blobs_unpacked(2);
    bottom_blobs_unpacked[0] = bottom_blob_unpacked;
    bottom_blobs_unpacked[1] = reference_blob_unpacked;

    return Crop::forward(bottom_blobs_unpacked, top_blobs, opt);
}